

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

Error __thiscall
asmjit::ZoneVectorBase::_reserve(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  Slot *__src;
  void *__dest;
  size_t extraout_RDX;
  size_t size;
  ulong uVar1;
  size_t allocatedBytes;
  ulong local_38;
  
  uVar1 = this->_capacity;
  if (n <= uVar1) {
    return 0;
  }
  if (n * sizeOfT < n) {
    return 1;
  }
  if (heap->_zone == (Zone *)0x0) {
    _reserve();
LAB_0015e38f:
    _reserve();
  }
  else {
    __dest = ZoneHeap::_alloc(heap,n * sizeOfT,&local_38);
    if (__dest == (void *)0x0) {
      return 1;
    }
    __src = (Slot *)this->_data;
    size = this->_length;
    if (size != 0) {
      memcpy(__dest,__src,size * sizeOfT);
      size = extraout_RDX;
    }
    if (__src == (Slot *)0x0) {
LAB_0015e35a:
      this->_capacity = local_38 / sizeOfT;
      if (n <= local_38 / sizeOfT) {
        this->_data = __dest;
        return 0;
      }
      goto LAB_0015e38f;
    }
    if (heap->_zone != (Zone *)0x0) {
      uVar1 = uVar1 * sizeOfT;
      if (uVar1 == 0) goto LAB_0015e399;
      if (uVar1 < 0x201) {
        if (uVar1 < 0x81) {
          uVar1 = uVar1 + 0x1fffffffff >> 5;
        }
        else {
          uVar1 = (uVar1 + 0x3fffffff7f >> 6) + 4;
        }
        __src->next = heap->_slots[uVar1 & 0xffffffff];
        heap->_slots[uVar1 & 0xffffffff] = __src;
      }
      else {
        ZoneHeap::_releaseDynamic(heap,__src,size);
      }
      goto LAB_0015e35a;
    }
  }
  _reserve();
LAB_0015e399:
  _reserve();
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  size_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorNoHeapMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(heap->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorNoHeapMemory);

  void* oldData = _data;
  if (_length)
    ::memcpy(newData, oldData, _length * sizeOfT);

  if (oldData)
    heap->release(oldData, oldCapacity * sizeOfT);

  _capacity = allocatedBytes / sizeOfT;
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}